

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O3

void __thiscall FGLRenderBuffers::CreateBloom(FGLRenderBuffers *this,int width,int height)

{
  uint *puVar1;
  GLuint GVar2;
  FGLRenderBuffers *pFVar3;
  long lVar4;
  uint uVar5;
  uint uVar7;
  undefined1 auVar6 [16];
  uint uVar8;
  uint uVar9;
  
  ClearBloom(this);
  if (0 < height && 0 < width) {
    auVar6._0_4_ = ((uint)width >> 1) + (uint)((uint)width >> 1 == 0);
    auVar6._4_4_ = ((uint)height >> 1) + (uint)((uint)height >> 1 == 0);
    auVar6._8_4_ = 1;
    auVar6[0xc] = 1;
    auVar6._13_3_ = 0;
    lVar4 = 0x14;
    do {
      uVar8 = auVar6._0_4_ / 2;
      uVar9 = auVar6._4_4_ / 2;
      uVar5 = -(uint)(1 < (int)uVar8);
      uVar7 = -(uint)(1 < (int)uVar9);
      puVar1 = (uint *)((long)this->BloomLevels + lVar4 + -4);
      *puVar1 = ~uVar5 & 1 | uVar8 & uVar5;
      puVar1[1] = ~uVar7 & 1 | uVar9 & uVar7;
      pFVar3 = (FGLRenderBuffers *)&stack0xffffffffffffffc8;
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.VTexture");
      GVar2 = Create2DTexture(pFVar3,(FString *)&stack0xffffffffffffffc8,0x881a,
                              *(int *)((long)this->BloomLevels + lVar4 + -4),
                              *(int *)((long)&this->BloomLevels[0].VTexture + lVar4));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0x14) = GVar2;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      pFVar3 = (FGLRenderBuffers *)&stack0xffffffffffffffc8;
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.HTexture");
      GVar2 = Create2DTexture(pFVar3,(FString *)&stack0xffffffffffffffc8,0x881a,
                              *(int *)((long)this->BloomLevels + lVar4 + -4),
                              *(int *)((long)&this->BloomLevels[0].VTexture + lVar4));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0xc) = GVar2;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.VFramebuffer");
      GVar2 = CreateFrameBuffer(this,(FString *)&stack0xffffffffffffffc8,
                                *(GLuint *)((long)this->BloomLevels + lVar4 + -0x14));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0x10) = GVar2;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.HFramebuffer");
      GVar2 = CreateFrameBuffer(this,(FString *)&stack0xffffffffffffffc8,
                                *(GLuint *)((long)this->BloomLevels + lVar4 + -0xc));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -8) = GVar2;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)this->BloomLevels + lVar4 + -4);
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x74);
  }
  return;
}

Assistant:

void FGLRenderBuffers::CreateBloom(int width, int height)
{
	ClearBloom();
	
	// No scene, no bloom!
	if (width <= 0 || height <= 0)
		return;

	int bloomWidth = MAX(width / 2, 1);
	int bloomHeight = MAX(height / 2, 1);
	for (int i = 0; i < NumBloomLevels; i++)
	{
		auto &level = BloomLevels[i];
		level.Width = MAX(bloomWidth / 2, 1);
		level.Height = MAX(bloomHeight / 2, 1);

		level.VTexture = Create2DTexture("Bloom.VTexture", GL_RGBA16F, level.Width, level.Height);
		level.HTexture = Create2DTexture("Bloom.HTexture", GL_RGBA16F, level.Width, level.Height);
		level.VFramebuffer = CreateFrameBuffer("Bloom.VFramebuffer", level.VTexture);
		level.HFramebuffer = CreateFrameBuffer("Bloom.HFramebuffer", level.HTexture);

		bloomWidth = level.Width;
		bloomHeight = level.Height;
	}
}